

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O1

size_t FSE_compress_wksp(void *dst,size_t dstSize,void *src,size_t srcSize,uint maxSymbolValue,
                        uint tableLog,void *workSpace,size_t wkspSize)

{
  uint maxSymbolValue_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  void *dst_00;
  size_t workSpaceSize;
  S16 norm [256];
  uint count [256];
  uint local_654;
  void *local_650;
  size_t local_648;
  void *local_640;
  short local_638 [256];
  uint local_438 [258];
  
  iVar2 = 1 << ((char)tableLog - 1U & 0x1f);
  iVar8 = 0x400;
  if (0xc < tableLog) {
    iVar8 = 1 << ((char)tableLog - 2U & 0x1f);
  }
  if (wkspSize < iVar8 + iVar2 + maxSymbolValue * 2 + 3) {
    return 0xffffffffffffffd4;
  }
  if (srcSize < 2) {
    return 0;
  }
  uVar4 = (ulong)(iVar2 + maxSymbolValue * 2 + 3);
  local_640 = (void *)((long)workSpace + uVar4 * 4);
  workSpaceSize = wkspSize + uVar4 * -4;
  local_654 = maxSymbolValue;
  if (maxSymbolValue == 0) {
    local_654 = 0xff;
  }
  uVar11 = 0xb;
  if (tableLog != 0) {
    uVar11 = tableLog;
  }
  local_648 = dstSize;
  sVar5 = HIST_count_wksp(local_438,&local_654,src,srcSize,local_640,workSpaceSize);
  maxSymbolValue_00 = local_654;
  if (sVar5 < 0xffffffffffffff89) {
    if (sVar5 != srcSize) {
      bVar1 = sVar5 != 1 && srcSize >> 7 <= sVar5;
      sVar5 = 0;
      goto LAB_004bf74a;
    }
    sVar5 = 1;
  }
  bVar1 = false;
LAB_004bf74a:
  sVar6 = sVar5;
  if (bVar1) {
    uVar9 = (uint)srcSize;
    uVar10 = 0x1f;
    if (uVar9 - 1 != 0) {
      for (; uVar9 - 1 >> uVar10 == 0; uVar10 = uVar10 - 1) {
      }
    }
    uVar3 = (uVar10 ^ 0xffffffe0) + 0x1e;
    uVar10 = 0x1f;
    if (uVar9 != 0) {
      for (; uVar9 >> uVar10 == 0; uVar10 = uVar10 - 1) {
      }
    }
    uVar9 = (uVar10 ^ 0xffffffe0) + 0x21;
    uVar10 = 0x1f;
    if (local_654 != 0) {
      for (; local_654 >> uVar10 == 0; uVar10 = uVar10 - 1) {
      }
    }
    uVar10 = (uVar10 ^ 0xffffffe0) + 0x22;
    if (uVar9 < uVar10) {
      uVar10 = uVar9;
    }
    if (uVar11 <= uVar3) {
      uVar3 = uVar11;
    }
    if (uVar3 < uVar10) {
      uVar3 = uVar10;
    }
    uVar11 = 5;
    if (5 < uVar3) {
      uVar11 = uVar3;
    }
    uVar10 = 0xc;
    if (uVar11 < 0xc) {
      uVar10 = uVar11;
    }
    local_650 = dst;
    sVar6 = FSE_normalizeCount(local_638,uVar10,local_438,srcSize,local_654);
    if (((sVar6 < 0xffffffffffffff89) &&
        (sVar7 = FSE_writeNCount(local_650,local_648,local_638,maxSymbolValue_00,uVar10),
        sVar6 = sVar7, sVar7 < 0xffffffffffffff89)) &&
       (sVar6 = FSE_buildCTable_wksp
                          ((FSE_CTable *)workSpace,local_638,local_654,uVar10,local_640,
                           workSpaceSize), sVar6 < 0xffffffffffffff89)) {
      dst_00 = (void *)((long)local_650 + sVar7);
      sVar6 = FSE_compress_usingCTable(dst_00,local_648 - sVar7,src,srcSize,(FSE_CTable *)workSpace)
      ;
      if (sVar6 < 0xffffffffffffff89) {
        if (sVar6 == 0) {
          bVar1 = false;
          sVar6 = 0;
        }
        else {
          dst_00 = (void *)((long)dst_00 + sVar6);
          bVar1 = true;
          sVar6 = sVar5;
        }
      }
      else {
        bVar1 = false;
      }
      if (bVar1) {
        sVar6 = 0;
        if ((ulong)((long)dst_00 - (long)local_650) < srcSize - 1) {
          sVar6 = (long)dst_00 - (long)local_650;
        }
      }
    }
  }
  return sVar6;
}

Assistant:

size_t FSE_compress_wksp (void* dst, size_t dstSize, const void* src, size_t srcSize, unsigned maxSymbolValue, unsigned tableLog, void* workSpace, size_t wkspSize)
{
    BYTE* const ostart = (BYTE*) dst;
    BYTE* op = ostart;
    BYTE* const oend = ostart + dstSize;

    unsigned count[FSE_MAX_SYMBOL_VALUE+1];
    S16   norm[FSE_MAX_SYMBOL_VALUE+1];
    FSE_CTable* CTable = (FSE_CTable*)workSpace;
    size_t const CTableSize = FSE_CTABLE_SIZE_U32(tableLog, maxSymbolValue);
    void* scratchBuffer = (void*)(CTable + CTableSize);
    size_t const scratchBufferSize = wkspSize - (CTableSize * sizeof(FSE_CTable));

    /* init conditions */
    if (wkspSize < FSE_WKSP_SIZE_U32(tableLog, maxSymbolValue)) return ERROR(tableLog_tooLarge);
    if (srcSize <= 1) return 0;  /* Not compressible */
    if (!maxSymbolValue) maxSymbolValue = FSE_MAX_SYMBOL_VALUE;
    if (!tableLog) tableLog = FSE_DEFAULT_TABLELOG;

    /* Scan input and build symbol stats */
    {   CHECK_V_F(maxCount, HIST_count_wksp(count, &maxSymbolValue, src, srcSize, scratchBuffer, scratchBufferSize) );
        if (maxCount == srcSize) return 1;   /* only a single symbol in src : rle */
        if (maxCount == 1) return 0;         /* each symbol present maximum once => not compressible */
        if (maxCount < (srcSize >> 7)) return 0;   /* Heuristic : not compressible enough */
    }

    tableLog = FSE_optimalTableLog(tableLog, srcSize, maxSymbolValue);
    CHECK_F( FSE_normalizeCount(norm, tableLog, count, srcSize, maxSymbolValue) );

    /* Write table description header */
    {   CHECK_V_F(nc_err, FSE_writeNCount(op, oend-op, norm, maxSymbolValue, tableLog) );
        op += nc_err;
    }

    /* Compress */
    CHECK_F( FSE_buildCTable_wksp(CTable, norm, maxSymbolValue, tableLog, scratchBuffer, scratchBufferSize) );
    {   CHECK_V_F(cSize, FSE_compress_usingCTable(op, oend - op, src, srcSize, CTable) );
        if (cSize == 0) return 0;   /* not enough space for compressed data */
        op += cSize;
    }

    /* check compressibility */
    if ( (size_t)(op-ostart) >= srcSize-1 ) return 0;

    return op-ostart;
}